

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

Ivy_Store_t * Ivy_CutComputeForNode(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  Ivy_Store_t *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Ivy_Cut_t *pCut_00;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pFanin;
  int local_70;
  int local_6c;
  int iLeaf1;
  int iLeaf0;
  int nLats;
  int Temp;
  int k;
  int i;
  Ivy_Obj_t *pLeaf;
  Ivy_Cut_t *pCut;
  Ivy_Cut_t *pCutNew;
  Ivy_Cut_t CutNew;
  int nLeaves_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  CutNew.pArray[5] = nLeaves;
  unique0x100003bb = pObj;
  if (6 < nLeaves) {
    __assert_fail("nLeaves <= IVY_CUT_INPUT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                  ,0x40a,"Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  Ivy_CutComputeForNode::pCutStore->nCuts = 0;
  Ivy_CutComputeForNode::pCutStore->nCutsMax = 0x100;
  CutNew.pArray[4] = 0;
  pCutNew._4_2_ = 1;
  pCutNew._6_2_ = (undefined2)nLeaves;
  CutNew.nLatches = Ivy_LeafCreate(pObj->Id,0);
  CutNew.pArray[4] = Ivy_CutHashValue(CutNew.nLatches);
  pIVar1 = Ivy_CutComputeForNode::pCutStore;
  iVar2 = Ivy_CutComputeForNode::pCutStore->nCuts;
  Ivy_CutComputeForNode::pCutStore->nCuts = iVar2 + 1;
  memcpy(pIVar1->pCuts + iVar2,(Ivy_Cut_t *)&pCutNew,0x24);
  if (Ivy_CutComputeForNode::pCutStore->nCuts != 1) {
    __assert_fail("pCutStore->nCuts == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                  ,0x417,"Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  for (Temp = 0; Temp < Ivy_CutComputeForNode::pCutStore->nCuts; Temp = Temp + 1) {
    pCut_00 = Ivy_CutComputeForNode::pCutStore->pCuts + Temp;
    if (pCut_00->nSize != 0) {
      for (nLats = 0; nLats < pCut_00->nSize; nLats = nLats + 1) {
        iVar2 = Ivy_LeafId(pCut_00->pArray[nLats]);
        pIVar5 = Ivy_ManObj(p,iVar2);
        iVar2 = Ivy_ObjIsCi(pIVar5);
        if ((iVar2 == 0) && (iVar2 = Ivy_ObjIsConst1(pIVar5), iVar2 == 0)) {
          iVar2 = Ivy_ObjIsNode(pIVar5);
          if (iVar2 == 0) {
            __assert_fail("Ivy_ObjIsNode(pLeaf)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                          ,0x425,"Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)"
                         );
          }
          iVar3 = Ivy_LeafLat(pCut_00->pArray[nLats]);
          pFanin = Ivy_ObjFanin0(pIVar5);
          local_6c = Ivy_CutReadLeaf(pFanin);
          pIVar5 = Ivy_ObjFanin1(pIVar5);
          iVar2 = Ivy_CutReadLeaf(pIVar5);
          iVar4 = Ivy_LeafLat(local_6c);
          if ((0xfe < iVar3 + iVar4) || (iVar4 = Ivy_LeafLat(iVar2), 0xfe < iVar3 + iVar4)) {
            __assert_fail("nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                          ,0x42b,"Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)"
                         );
          }
          local_6c = iVar3 + local_6c;
          iVar3 = iVar3 + iVar2;
          iVar2 = Ivy_CutPrescreen(pCut_00,local_6c,iVar3);
          if (iVar2 != 0) {
            local_70 = iVar3;
            if (iVar3 < local_6c) {
              local_70 = local_6c;
              local_6c = iVar3;
            }
            iVar2 = Ivy_CutDeriveNew(pCut_00,(Ivy_Cut_t *)&pCutNew,pCut_00->pArray[nLats],local_6c,
                                     local_70);
            if ((iVar2 != 0) &&
               (Ivy_CutFindOrAddFilter(Ivy_CutComputeForNode::pCutStore,(Ivy_Cut_t *)&pCutNew),
               Ivy_CutComputeForNode::pCutStore->nCuts == 0x100)) break;
          }
        }
      }
      if (Ivy_CutComputeForNode::pCutStore->nCuts == 0x100) break;
    }
  }
  if (Ivy_CutComputeForNode::pCutStore->nCuts == 0x100) {
    Ivy_CutComputeForNode::pCutStore->fSatur = 1;
  }
  else {
    Ivy_CutComputeForNode::pCutStore->fSatur = 0;
  }
  Ivy_CutCompactAll(Ivy_CutComputeForNode::pCutStore);
  return Ivy_CutComputeForNode::pCutStore;
}

Assistant:

Ivy_Store_t * Ivy_CutComputeForNode( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, Temp, nLats, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = Ivy_LeafCreate( pObj->Id, 0 );
    pCutNew->uHash = Ivy_CutHashValue( pCutNew->pArray[0] );
    // add the trivial cut
    pCutStore->pCuts[pCutStore->nCuts++] = *pCutNew;
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[k]) );
            if ( Ivy_ObjIsCi(pLeaf) || Ivy_ObjIsConst1(pLeaf) )
                continue;
            assert( Ivy_ObjIsNode(pLeaf) );
            nLats = Ivy_LeafLat(pCut->pArray[k]);

            // get the fanins fanins
            iLeaf0 = Ivy_CutReadLeaf( Ivy_ObjFanin0(pLeaf) );
            iLeaf1 = Ivy_CutReadLeaf( Ivy_ObjFanin1(pLeaf) );
            assert( nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK );
            iLeaf0 = nLats + iLeaf0;
            iLeaf1 = nLats + iLeaf1;
            if ( !Ivy_CutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            // the given cut exist
            if ( iLeaf0 > iLeaf1 )
                Temp = iLeaf0, iLeaf0 = iLeaf1, iLeaf1 = Temp;
            // create the new cut
            if ( !Ivy_CutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 ) )
                continue;
            // add the cut
            Ivy_CutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    if ( pCutStore->nCuts == IVY_CUT_LIMIT )
        pCutStore->fSatur = 1;
    else
        pCutStore->fSatur = 0;
//    printf( "%d ", pCutStore->nCuts );
    Ivy_CutCompactAll( pCutStore );
//    printf( "%d \n", pCutStore->nCuts );
//    Ivy_CutPrintForNodes( pCutStore );
    return pCutStore;
}